

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O0

bool __thiscall sf::priv::CursorImpl::loadFromSystem(CursorImpl *this,Type type)

{
  Cursor CVar1;
  undefined4 local_20;
  uint shape;
  Type type_local;
  CursorImpl *this_local;
  
  release(this);
  switch(type) {
  case Arrow:
    local_20 = 2;
    break;
  default:
    return false;
  case Wait:
    local_20 = 0x96;
    break;
  case Text:
    local_20 = 0x98;
    break;
  case Hand:
    local_20 = 0x3a;
    break;
  case SizeHorizontal:
    local_20 = 0x6c;
    break;
  case SizeVertical:
    local_20 = 0x74;
    break;
  case SizeAll:
    local_20 = 0x34;
    break;
  case Cross:
    local_20 = 0x22;
    break;
  case Help:
    local_20 = 0x5c;
    break;
  case NotAllowed:
    local_20 = 0;
  }
  CVar1 = XCreateFontCursor(this->m_display,local_20);
  this->m_cursor = CVar1;
  return true;
}

Assistant:

bool CursorImpl::loadFromSystem(Cursor::Type type)
{
    release();

    unsigned int shape;
    switch (type)
    {
        default: return false;

        case Cursor::Arrow:          shape = XC_arrow;              break;
        case Cursor::Wait:           shape = XC_watch;              break;
        case Cursor::Text:           shape = XC_xterm;              break;
        case Cursor::Hand:           shape = XC_hand1;              break;
        case Cursor::SizeHorizontal: shape = XC_sb_h_double_arrow;  break;
        case Cursor::SizeVertical:   shape = XC_sb_v_double_arrow;  break;
        case Cursor::SizeAll:        shape = XC_fleur;              break;
        case Cursor::Cross:          shape = XC_crosshair;          break;
        case Cursor::Help:           shape = XC_question_arrow;     break;
        case Cursor::NotAllowed:     shape = XC_X_cursor;           break;
    }

    m_cursor = XCreateFontCursor(m_display, shape);
    return true;
}